

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs,CBS *cbs)

{
  ssl_session_st *psVar1;
  uchar *puVar2;
  undefined8 __src;
  undefined8 __n;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined **ppuVar6;
  uint i;
  long lVar7;
  uint desc;
  SSL *ssl;
  size_t in_R8;
  uint uVar8;
  ptrdiff_t _Num;
  Span<const_unsigned_char> protocol;
  uint8_t alert;
  uint16_t type;
  CBS extensions;
  CBS extension;
  byte local_5b;
  ushort local_5a;
  undefined1 local_58 [40];
  
  ssl = hs->ssl;
  local_58._0_8_ = cbs->data;
  local_58._8_8_ = cbs->len;
  bVar3 = tls1_check_duplicate_extensions((CBS *)local_58);
  desc = 0x32;
  if (bVar3) {
    if ((SSL_CONFIG *)local_58._8_8_ == (SSL_CONFIG *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        iVar5 = CBS_get_u16((CBS *)local_58,&local_5a);
        desc = 0x32;
        if ((iVar5 == 0) ||
           (iVar5 = CBS_get_u16_length_prefixed((CBS *)local_58,(CBS *)(local_58 + 0x18)),
           iVar5 == 0)) goto LAB_0023b92b;
        ppuVar6 = &PTR_ext_sni_parse_serverhello_00432360;
        lVar7 = 0;
        while (*(ushort *)(ppuVar6 + -2) != local_5a) {
          lVar7 = lVar7 + 1;
          ppuVar6 = ppuVar6 + 5;
          if (lVar7 == 0x1c) {
            iVar5 = 0x1022;
            goto LAB_0023b8f1;
          }
        }
        if (((hs->extensions).sent >> ((uint)lVar7 & 0x1f) & 1) == 0) {
          iVar5 = 0x102d;
LAB_0023b8f1:
          ERR_put_error(0x10,0,0xde,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,iVar5);
          ERR_add_error_dataf("extension %u",(ulong)local_5a);
          desc = 0x6e;
          goto LAB_0023b92b;
        }
        local_5b = 0x32;
        cVar4 = (*(code *)*ppuVar6)(hs,&local_5b,local_58 + 0x18);
        if (cVar4 == '\0') {
          ERR_put_error(0x10,0,0x95,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x1037);
          ERR_add_error_dataf("extension %u",(ulong)local_5a);
          desc = (uint)local_5b;
          goto LAB_0023b92b;
        }
        uVar8 = uVar8 | 1 << ((byte)lVar7 & 0x1f);
      } while ((SSL_CONFIG *)local_58._8_8_ != (SSL_CONFIG *)0x0);
    }
    ppuVar6 = &PTR_ext_sni_parse_serverhello_00432360;
    lVar7 = 0;
    do {
      if ((uVar8 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
        local_58[0x18] = 0x32;
        cVar4 = (*(code *)*ppuVar6)(hs,local_58 + 0x18,0);
        if (cVar4 == '\0') {
          ERR_put_error(0x10,0,0xa4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x1044);
          ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(ppuVar6 + -2));
          desc = (uint)local_58[0x18];
          goto LAB_0023b92b;
        }
      }
      lVar7 = lVar7 + 1;
      ppuVar6 = ppuVar6 + 5;
    } while (lVar7 != 0x1c);
    psVar1 = (hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    if (psVar1 == (ssl_session_st *)0x0) {
      return true;
    }
    if ((psVar1->field_0x1b8 & 0x40) == 0) {
      return true;
    }
    ssl = hs->ssl;
    puVar2 = (uchar *)(ssl->s3->alpn_selected).size_;
    if (puVar2 == (uchar *)0x0) {
      ERR_put_error(0x10,0,0x134,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1070);
      ssl_send_alert(ssl,2,0x2f);
      return false;
    }
    local_58._0_8_ = (SSL *)0x0;
    local_58._8_8_ = (SSL_CONFIG *)0x0;
    protocol.size_ = in_R8;
    protocol.data_ = puVar2;
    bVar3 = ssl_get_local_application_settings
                      ((bssl *)hs,(SSL_HANDSHAKE *)local_58,
                       (Span<const_unsigned_char> *)(ssl->s3->alpn_selected).data_,protocol);
    __n = local_58._8_8_;
    __src = local_58._0_8_;
    if (bVar3) {
      bVar3 = Array<unsigned_char>::InitUninitialized
                        (&psVar1->local_application_settings,local_58._8_8_);
      if ((SSL_CONFIG *)__n != (SSL_CONFIG *)0x0 && bVar3) {
        memmove((psVar1->local_application_settings).data_,(void *)__src,__n);
      }
      desc = 0x50;
      if (bVar3) {
        return true;
      }
    }
    else {
      ERR_put_error(0x10,0,0x103,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1079);
      desc = 0x2f;
    }
  }
LAB_0023b92b:
  ssl_send_alert(ssl,2,desc);
  return false;
}

Assistant:

bool ssl_parse_serverhello_tlsext(SSL_HANDSHAKE *hs, const CBS *cbs) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_serverhello_tlsext(hs, cbs, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_serverhello_tlsext(hs)) {
    return false;
  }

  return true;
}